

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup.cpp
# Opt level: O2

void scm::setupEnvironment(Environment *env)

{
  allocator<char> local_769;
  string helpText;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  helpText._M_dataplus._M_p = (pointer)&helpText.field_2;
  helpText._M_string_length = 0;
  helpText.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"quote",&local_769);
  std::__cxx11::string::string((string *)&local_48,(string *)&helpText);
  defineNewSyntax(env,&local_28,-1,SYNTAX_QUOTE,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"if",&local_769);
  std::__cxx11::string::string((string *)&local_88,(string *)&helpText);
  defineNewSyntax(env,&local_68,-1,SYNTAX_IF,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"define",&local_769);
  std::__cxx11::string::string((string *)&local_c8,(string *)&helpText);
  defineNewSyntax(env,&local_a8,-1,SYNTAX_DEFINE,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"set!",&local_769);
  std::__cxx11::string::string((string *)&local_108,(string *)&helpText);
  defineNewSyntax(env,&local_e8,-1,SYNTAX_SET,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"lambda",&local_769);
  std::__cxx11::string::string((string *)&local_148,(string *)&helpText);
  defineNewSyntax(env,&local_128,-1,SYNTAX_LAMBDA,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"begin",&local_769);
  std::__cxx11::string::string((string *)&local_188,(string *)&helpText);
  defineNewSyntax(env,&local_168,-1,SYNTAX_BEGIN,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"help",&local_769);
  std::__cxx11::string::string((string *)&local_1c8,(string *)&helpText);
  defineNewSyntax(env,&local_1a8,0,SYNTAX_HELP,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"+",&local_769);
  std::__cxx11::string::string((string *)&local_208,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_1e8,-1,FUNC_ADD,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"-",&local_769);
  std::__cxx11::string::string((string *)&local_248,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_228,-1,FUNC_SUB,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"*",&local_769);
  std::__cxx11::string::string((string *)&local_288,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_268,-1,FUNC_MULT,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"/",&local_769);
  std::__cxx11::string::string((string *)&local_2c8,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_2a8,-1,FUNC_DIV,&local_2c8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"eq?",&local_769);
  std::__cxx11::string::string((string *)&local_308,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_2e8,2,FUNC_EQ,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,"equal-string?",&local_769);
  std::__cxx11::string::string((string *)&local_348,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_328,2,FUNC_EQUAL_STRING,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"=",&local_769);
  std::__cxx11::string::string((string *)&local_388,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_368,2,FUNC_EQUAL_NUMBER,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::__cxx11::string::~string((string *)&local_368);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a8,">",&local_769);
  std::__cxx11::string::string((string *)&local_3c8,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_3a8,2,FUNC_GT,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"<",&local_769);
  std::__cxx11::string::string((string *)&local_408,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_3e8,2,FUNC_LT,&local_408);
  std::__cxx11::string::~string((string *)&local_408);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_428,"cons",&local_769);
  std::__cxx11::string::string((string *)&local_448,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_428,2,FUNC_CONS,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&local_428);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,"car",&local_769);
  std::__cxx11::string::string((string *)&local_488,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_468,1,FUNC_CAR,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"cdr",&local_769);
  std::__cxx11::string::string((string *)&local_4c8,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_4a8,1,FUNC_CDR,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"list",&local_769);
  std::__cxx11::string::string((string *)&local_508,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_4e8,-1,FUNC_LIST,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"display",&local_769);
  std::__cxx11::string::string((string *)&local_548,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_528,-1,FUNC_DISPLAY,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,"function-body",&local_769);
  std::__cxx11::string::string((string *)&local_588,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_568,1,FUNC_FUNCTION_BODY,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"function-arglist",&local_769);
  std::__cxx11::string::string((string *)&local_5c8,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_5a8,1,FUNC_FUNCTION_ARGLIST,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5e8,"string?",&local_769);
  std::__cxx11::string::string((string *)&local_608,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_5e8,1,FUNC_IS_STRING,&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"number?",&local_769);
  std::__cxx11::string::string((string *)&local_648,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_628,1,FUNC_IS_NUMBER,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::__cxx11::string::~string((string *)&local_628);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"cons?",&local_769);
  std::__cxx11::string::string((string *)&local_688,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_668,1,FUNC_IS_CONS,&local_688);
  std::__cxx11::string::~string((string *)&local_688);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"function?",&local_769);
  std::__cxx11::string::string((string *)&local_6c8,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_6a8,1,FUNC_IS_FUNC,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6e8,"user-function?",&local_769);
  std::__cxx11::string::string((string *)&local_708,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_6e8,1,FUNC_IS_USERFUNC,&local_708);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::assign((char *)&helpText);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_728,"bool?",&local_769);
  std::__cxx11::string::string((string *)&local_748,(string *)&helpText);
  defineNewBuiltinFunction(env,&local_728,1,FUNC_IS_BOOL,&local_748);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&helpText);
  return;
}

Assistant:

void setupEnvironment(Environment& env)
{
  std::string helpText{};
  // setup syntax
  helpText =
      "returns the first argument:\n\
  (quote 1 2 3) -> 1\n\
  (quote (1 2 3)) -> (1 2 3)\n\
  shorthand: '(1 2 3)";
  defineNewSyntax(env, "quote", -1, SYNTAX_QUOTE, helpText);
  helpText =
      "returns the first expression if the condition is true, the second otherwise:\n\
  (if #t 1 2) -> 1\n\
  (if #f 1 2) -> 2";
  defineNewSyntax(env, "if", -1, SYNTAX_IF, helpText);
  helpText =
      "defines a value to the given variable name\n\
  (define a 10) -> a := 10\n\
  can be used in shorthand form for lambda definition\n\
  (define (plus1 x) (+ x 1)";
  defineNewSyntax(env, "define", -1, SYNTAX_DEFINE, helpText);
  helpText =
      "defines a value to the given variable name in all environments\n\
  (set! a 10) -> a := 10";
  defineNewSyntax(env, "set!", -1, SYNTAX_SET, helpText);
  helpText =
      "defines a new function\n\
  (lambda (arg1 arg2) (+ arg1 arg2)\n\
  use in combination with define";
  defineNewSyntax(env, "lambda", -1, SYNTAX_LAMBDA, helpText);
  helpText =
      "evaluate multiple expressions and return last result\n\
  (begin (+ 1 1) (+ 2 2)) -> 4";
  defineNewSyntax(env, "begin", -1, SYNTAX_BEGIN, helpText);
  helpText =
      "show help text for a given element\n\
  help -> shows all defined variables, functions and syntax elements\n\
  (help fname) -> shows a help text for the given function";
  defineNewSyntax(env, "help", 0, SYNTAX_HELP, helpText);

  // setup builtin functions
  helpText =
      "adds multiple numbers and/or strings\n\
  (+ 1 2 3) -> 6\n\
  (+ 1 2 2.5) -> 5.5\n\
  (+ \"hello \" \"world!\") -> \"hello world!\"\n\
  (+ \"hello \" 1 \" world!\") -> \"hello 1 world!\"\n\
  priority: string > float > integer";
  defineNewBuiltinFunction(env, "+", -1, FUNC_ADD, helpText);
  helpText =
      "subtracts the sum of multiple numbers from the first argument\n\
  (- 1 2 3) -> 4\n\
  (- 1 2 2.5) -> 3.5";
  defineNewBuiltinFunction(env, "-", -1, FUNC_SUB, helpText);
  helpText =
      "multiplies all arguments with each other\n\
  (* 2 2 2) -> 8";
  defineNewBuiltinFunction(env, "*", -1, FUNC_MULT, helpText);
  helpText =
      "divides the first argument by the product of all other arguments\n\
  (/ 2 2 2) -> 0.5";
  defineNewBuiltinFunction(env, "/", -1, FUNC_DIV, helpText);
  helpText =
      "returns true if same exact object\n\
  (eq? 1 1) -> #f\n\
  (eq? a a) -> #t";
  defineNewBuiltinFunction(env, "eq?", 2, FUNC_EQ, helpText);
  helpText =
      "returns true if the passed strings are identical\n\
  (equal-string? \"asd\" \"asd\") -> #t\n\
  (equal-string? \"asd\" \"qwe\") -> #f";
  defineNewBuiltinFunction(env, "equal-string?", 2, FUNC_EQUAL_STRING, helpText);
  helpText =
      "returns true if the passed numbers are equal\n\
  (= 1 1) -> #t\n\
  (= 1 2) -> #f\n\
  (= 1 1.0) -> #t";
  defineNewBuiltinFunction(env, "=", 2, FUNC_EQUAL_NUMBER, helpText);
  helpText =
      "returns true if the first numbers is greater than the latter\n\
  (> 1 1) -> #f\n\
  (> 3 2) -> #t\n\
  (> 0 1.0) -> #f";
  defineNewBuiltinFunction(env, ">", 2, FUNC_GT, helpText);
  helpText =
      "returns true if the first numbers is lesser than the latter\n\
  (< 1 1) -> #f\n\
  (< 3 2) -> #f\n\
  (< 0 1.0) -> #t";
  defineNewBuiltinFunction(env, "<", 2, FUNC_LT, helpText);
  helpText =
      "assembles a new cons object\n\
  (cons 1 2) -> (1 . 2)\n\
  (cons 1 '(2 3)) -> (1 2 3)";
  defineNewBuiltinFunction(env, "cons", 2, FUNC_CONS, helpText);
  helpText =
      "get the car of a cons\n\
  (car '(1 2 3)) -> 1";
  defineNewBuiltinFunction(env, "car", 1, FUNC_CAR, helpText);
  helpText =
      "get the cdr of a cons\n\
  (cdr '(1 2 3)) -> (2 3)";
  defineNewBuiltinFunction(env, "cdr", 1, FUNC_CDR, helpText);
  helpText =
      "assembles a list with the given arguments\n\
  (list 1 2 3) -> (1 2 3)";
  defineNewBuiltinFunction(env, "list", -1, FUNC_LIST, helpText);
  helpText =
      "displays the passed argument, best used within functions\n\
  (display 1 2 3) -> returns void, prints (1 2 3)";
  defineNewBuiltinFunction(env, "display", -1, FUNC_DISPLAY, helpText);
  helpText = "returns the function body of a given lambda";
  defineNewBuiltinFunction(env, "function-body", 1, FUNC_FUNCTION_BODY, helpText);
  helpText = "returns the function argument list of a given lambda";
  defineNewBuiltinFunction(env, "function-arglist", 1, FUNC_FUNCTION_ARGLIST, helpText);
  helpText = "returns true if the argument is a string";
  defineNewBuiltinFunction(env, "string?", 1, FUNC_IS_STRING, helpText);
  helpText = "returns true if the argument is an integer or a float value";
  defineNewBuiltinFunction(env, "number?", 1, FUNC_IS_NUMBER, helpText);
  helpText = "returns true if the argument is a cons object";
  defineNewBuiltinFunction(env, "cons?", 1, FUNC_IS_CONS, helpText);
  helpText = "returns true if the argument is a builtin function";
  defineNewBuiltinFunction(env, "function?", 1, FUNC_IS_FUNC, helpText);
  helpText = "returns true if the argument is a user defined function";
  defineNewBuiltinFunction(env, "user-function?", 1, FUNC_IS_USERFUNC, helpText);
  helpText = "returns true if the argument is real bool value";
  defineNewBuiltinFunction(env, "bool?", 1, FUNC_IS_BOOL, helpText);
}